

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,HttpHeaderTable *responseHeaderTable,AsyncIoStream *stream,
                 HttpClientSettings *settings)

{
  HttpClientImpl *this_00;
  HttpClient *extraout_RDX;
  HttpClient *extraout_RDX_00;
  HttpClient *pHVar1;
  Own<kj::HttpClient,_std::nullptr_t> OVar2;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_68;
  HttpClientSettings local_58;
  
  this_00 = (HttpClientImpl *)operator_new(0x178);
  local_68.disposer = (Disposer *)&NullDisposer::instance;
  local_58.idleTimeout.value = (settings->idleTimeout).value;
  local_58.entropySource.ptr = (settings->entropySource).ptr;
  local_58.errorHandler.ptr = (settings->errorHandler).ptr;
  (settings->entropySource).ptr = (EntropySource *)0x0;
  (settings->errorHandler).ptr = (HttpClientErrorHandler *)0x0;
  local_58.webSocketCompressionMode = settings->webSocketCompressionMode;
  local_58.webSocketErrorHandler.ptr = (settings->webSocketErrorHandler).ptr;
  local_58.tlsContext.ptr = (settings->tlsContext).ptr;
  (settings->webSocketErrorHandler).ptr = (WebSocketErrorHandler *)0x0;
  (settings->tlsContext).ptr = (SecureNetworkWrapper *)0x0;
  local_68.ptr = stream;
  anon_unknown_36::HttpClientImpl::HttpClientImpl(this_00,responseHeaderTable,&local_68,&local_58);
  pHVar1 = extraout_RDX;
  if (local_68.ptr != (AsyncIoStream *)0x0) {
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,
               ((local_68.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&((local_68.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream);
    pHVar1 = extraout_RDX_00;
  }
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::instance;
  *(HttpClientImpl **)(this + 8) = this_00;
  OVar2.ptr = pHVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<HttpClient> newHttpClient(
    const HttpHeaderTable& responseHeaderTable, kj::AsyncIoStream& stream,
    HttpClientSettings settings) {
  return kj::heap<HttpClientImpl>(responseHeaderTable,
      kj::Own<kj::AsyncIoStream>(&stream, kj::NullDisposer::instance),
      kj::mv(settings));
}